

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

Bool tidyOptCopyConfig(TidyDoc to,TidyDoc from)

{
  bool bVar1;
  TidyDocImpl *docFrom;
  TidyDocImpl *docTo;
  
  bVar1 = from != (TidyDoc)0x0 && to != (TidyDoc)0x0;
  if (bVar1) {
    prvTidyCopyConfig((TidyDocImpl *)to,(TidyDocImpl *)from);
  }
  return (uint)bVar1;
}

Assistant:

Bool TIDY_CALL tidyOptCopyConfig( TidyDoc to, TidyDoc from )
{
    TidyDocImpl* docTo = tidyDocToImpl( to );
    TidyDocImpl* docFrom = tidyDocToImpl( from );
    if ( docTo && docFrom )
    {
        TY_(CopyConfig)( docTo, docFrom );
        return yes;
    }
    return no;
}